

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

QString * QSysInfo::prettyProductName(void)

{
  long lVar1;
  int iVar2;
  QString *pQVar3;
  storage_type *in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QArrayDataPointer<char16_t> local_280;
  QArrayDataPointer<char16_t> local_268;
  QUnixOSVersion local_248;
  QStringBuilder<QString,_char16_t> local_1f8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_1d8;
  utsname u;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_248.prettyName.d.d = (Data *)0x0;
  local_248.prettyName.d.ptr = (char16_t *)0x0;
  local_248.productVersion.d.ptr = (char16_t *)0x0;
  local_248.productVersion.d.size = 0;
  local_248.productType.d.size = 0;
  local_248.productVersion.d.d = (Data *)0x0;
  local_248.productType.d.d = (Data *)0x0;
  local_248.productType.d.ptr = (char16_t *)0x0;
  local_248.prettyName.d.size = 0;
  findUnixOsVersion(&local_248);
  if (local_248.prettyName.d.size == 0) {
    memset((utsname *)&u,0xaa,0x186);
    iVar2 = uname((utsname *)&u);
    if (iVar2 == 0) {
      pQVar3 = (QString *)QByteArrayView::lengthHelperCharArray(u.sysname,0x41);
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)&u;
      QString::fromLatin1((QString *)&local_268,pQVar3,ba);
      local_1f8.a.d.size = local_268.size;
      local_1f8.a.d.ptr = local_268.ptr;
      local_1f8.a.d.d = local_268.d;
      local_268.d = (Data *)0x0;
      local_268.ptr = (char16_t *)0x0;
      local_268.size = 0;
      local_1f8.b = L' ';
      pQVar3 = (QString *)QByteArrayView::lengthHelperCharArray(u.release,0x41);
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)u.release;
      QString::fromLatin1((QString *)&local_280,pQVar3,ba_00);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
                (&local_1d8,&local_1f8,(QString *)&local_280);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
                (in_RDI,&local_1d8);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_280);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
    }
    else {
      unknownText();
    }
  }
  else {
    (in_RDI->d).d = local_248.prettyName.d.d;
    (in_RDI->d).ptr = local_248.prettyName.d.ptr;
    (in_RDI->d).size = local_248.prettyName.d.size;
    if (local_248.prettyName.d.d != (Data *)0x0) {
      LOCK();
      ((local_248.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_248.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
  }
  QUnixOSVersion::~QUnixOSVersion(&local_248);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::prettyProductName()
{
#if defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN) || defined(Q_OS_WIN)
    const auto version = QOperatingSystemVersion::current();
    const int majorVersion = version.majorVersion();
    const QString versionString = QString::asprintf("%d.%d", majorVersion, version.minorVersion());
    QString result = version.name() + u' ';
    const char *name = osVer_helper(version);
    if (!name)
        return result + versionString;
    result += QLatin1StringView(name);
#  if !defined(Q_OS_WIN)
    return result + " ("_L1 + versionString + u')';
#  else
    // (resembling winver.exe): Windows 10 "Windows 10 Version 1809"
    const auto displayVersion = windowsDisplayVersion();
    if (!displayVersion.isEmpty())
        result += " Version "_L1 + displayVersion;
    return result;
#  endif // Windows
#elif defined(Q_OS_HAIKU)
    return "Haiku "_L1 + productVersion();
#elif defined(Q_OS_UNIX)
#  ifdef USE_ETC_OS_RELEASE
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.prettyName.isEmpty())
        return unixOsVersion.prettyName;
#  endif
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.sysname) + u' ' + QString::fromLatin1(u.release);
#endif
    return unknownText();
}